

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

void CivetServer::urlEncode(char *src,size_t src_len,string *dst,bool append)

{
  int iVar1;
  out_of_range *this;
  char local_27 [4];
  char local_23 [3];
  char dst_buf [4];
  char buf [2];
  string *psStack_20;
  bool append_local;
  string *dst_local;
  size_t src_len_local;
  char *src_local;
  
  local_23[2] = append;
  psStack_20 = dst;
  dst_local = (string *)src_len;
  src_len_local = (size_t)src;
  if (!append) {
    std::__cxx11::string::clear();
  }
  do {
    if (dst_local == (string *)0x0) {
      return;
    }
    if (*(char *)src_len_local == '\0') {
      std::__cxx11::string::push_back((char)psStack_20);
    }
    else {
      local_23[0] = *(char *)src_len_local;
      local_23[1] = 0;
      iVar1 = mg_url_encode(local_23,local_27,4);
      if (iVar1 < 0) {
        this = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this,"");
        __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      std::__cxx11::string::append((char *)psStack_20);
    }
    src_len_local = src_len_local + 1;
    dst_local = (string *)((long)&dst_local[-1].field_2 + 0xf);
  } while( true );
}

Assistant:

void
CivetServer::urlEncode(const char *src,
                       size_t src_len,
                       std::string &dst,
                       bool append)
{
	if (!append)
		dst.clear();

	for (; src_len > 0; src++, src_len--) {
		if (*src == '\0') {
			// src and dst can contain NUL characters without encoding
			dst.push_back(*src);
		} else {
			char buf[2] = {*src, '\0'};
			char dst_buf[4];
			if (mg_url_encode(buf, dst_buf, sizeof(dst_buf)) < 0) {
				// never reach here
				throw std::out_of_range("");
			}
			dst.append(dst_buf);
		}
	}
}